

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int main(int param_1,char **param_2)

{
  col_type *pcVar1;
  double dVar2;
  PFNGLUNIFORM1IPROC p_Var3;
  PFNGLUNIFORMMATRIX4FVPROC p_Var4;
  int iVar5;
  GLint GVar6;
  GLFWwindow *window;
  long *plVar7;
  size_t sVar8;
  stbi_uc *psVar9;
  float *pfVar10;
  ulong uVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  bool show_another_window;
  int height;
  int width;
  uint VAO;
  uint texture2;
  uint texture1;
  uint VBO;
  undefined8 local_8c8;
  float fStack_8c0;
  float fStack_8bc;
  float fStack_8b8;
  float fStack_8b4;
  undefined8 uStack_8b0;
  undefined8 uStack_8a8;
  float local_8a0;
  float local_89c;
  float fStack_898;
  float fStack_894;
  float fStack_890;
  float fStack_88c;
  float a;
  int nrChannels;
  tmat4x4<float,_(glm::precision)0> Result;
  long *local_830 [2];
  long local_820 [2];
  tmat4x4<float,_(glm::precision)0> Result_1;
  int nrAttributes;
  string local_7c8;
  string local_7a8;
  float local_788;
  Shader shader;
  char path [1024];
  float vertices [180];
  
  show_another_window = true;
  glfwSetErrorCallback(error_callback);
  iVar5 = glfwInit();
  if (iVar5 == 0) {
    iVar5 = 1;
  }
  else {
    glfwWindowHint(0x22002,3);
    glfwWindowHint(0x22003,3);
    glfwWindowHint(0x22008,0x32001);
    window = (GLFWwindow *)glfwCreateWindow(800,600,"ImGui GLFW example 09",0,0);
    glfwMakeContextCurrent(window);
    glfwSetFramebufferSizeCallback(window,framebuffer_size_callback);
    glfwSetCursorPosCallback(window,mouse_callback);
    glfwSetScrollCallback(window,scroll_callback);
    glfwSetInputMode(window,0x33001,0x34003);
    gl3wInit();
    (*gl3wEnable)(0xb71);
    (*gl3wGetIntegerv)(0x8869,&nrAttributes);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Maximum nr of vertex attributes supported: ",0x2b);
    plVar7 = (long *)std::ostream::operator<<((ostream *)&std::cout,nrAttributes);
    std::ios::widen((char)*(undefined8 *)(*plVar7 + -0x18) + (char)plVar7);
    std::ostream::put((char)plVar7);
    std::ostream::flush();
    ImGui_ImplGlfwGL3_Init(window,true);
    getcwd(path,0x3ff);
    shader.mFSsource._M_dataplus._M_p = (pointer)&shader.mFSsource.field_2;
    shader.mFSsource._M_string_length = 0;
    shader.mFSsource.field_2._M_local_buf[0] = '\0';
    shader.mVSsource._M_dataplus._M_p = (pointer)&shader.mVSsource.field_2;
    shader.mVSsource._M_string_length = 0;
    shader.mVSsource.field_2._M_local_buf[0] = '\0';
    shader.mGSsource._M_dataplus._M_p = (pointer)&shader.mGSsource.field_2;
    shader.mGSsource._M_string_length = 0;
    shader.mGSsource.field_2._M_local_buf[0] = '\0';
    local_7a8._M_dataplus._M_p = (pointer)&local_7a8.field_2;
    sVar8 = strlen(path);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_7a8,path,path + sVar8);
    Shader::loadVS(&shader,&local_7a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_7a8._M_dataplus._M_p != &local_7a8.field_2) {
      operator_delete(local_7a8._M_dataplus._M_p,local_7a8.field_2._M_allocated_capacity + 1);
    }
    local_7c8._M_dataplus._M_p = (pointer)&local_7c8.field_2;
    sVar8 = strlen(path);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_7c8,path,path + sVar8);
    Shader::loadFS(&shader,&local_7c8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_7c8._M_dataplus._M_p != &local_7c8.field_2) {
      operator_delete(local_7c8._M_dataplus._M_p,local_7c8.field_2._M_allocated_capacity + 1);
    }
    Shader::build(&shader);
    memcpy(vertices,&DAT_0015f670,0x2d0);
    (*gl3wGenVertexArrays)(1,&VAO);
    (*gl3wGenBuffers)(1,&VBO);
    (*gl3wBindVertexArray)(VAO);
    (*gl3wBindBuffer)(0x8892,VBO);
    (*gl3wBufferData)(0x8892,0x2d0,vertices,0x88e4);
    (*gl3wVertexAttribPointer)(0,3,0x1406,'\0',0x14,(GLvoid *)0x0);
    (*gl3wEnableVertexAttribArray)(0);
    (*gl3wVertexAttribPointer)(1,2,0x1406,'\0',0x14,(GLvoid *)0xc);
    (*gl3wEnableVertexAttribArray)(1);
    (*gl3wGenTextures)(1,&texture1);
    (*gl3wBindTexture)(0xde1,texture1);
    (*gl3wTexParameteri)(0xde1,0x2802,0x2901);
    (*gl3wTexParameteri)(0xde1,0x2803,0x2901);
    (*gl3wTexParameteri)(0xde1,0x2801,0x2601);
    (*gl3wTexParameteri)(0xde1,0x2800,0x2601);
    stbi__vertically_flip_on_load = 1;
    getcwd(path,0x3ff);
    sVar8 = strlen(path);
    builtin_strncpy(path + sVar8,"/container.jpg",0xf);
    printf("path[%s]\n",path);
    psVar9 = stbi_load(path,&width,&height,&nrChannels,0);
    if (psVar9 == (stbi_uc *)0x0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Failed to load texture",0x16);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x80);
      std::ostream::put(-0x80);
      std::ostream::flush();
    }
    else {
      (*gl3wTexImage2D)(0xde1,0,0x1907,width,height,0,0x1907,0x1401,psVar9);
      (*gl3wGenerateMipmap)(0xde1);
      free(psVar9);
    }
    (*gl3wGenTextures)(1,&texture2);
    (*gl3wBindTexture)(0xde1,texture2);
    (*gl3wTexParameteri)(0xde1,0x2802,0x2901);
    (*gl3wTexParameteri)(0xde1,0x2803,0x2901);
    (*gl3wTexParameteri)(0xde1,0x2801,0x2601);
    (*gl3wTexParameteri)(0xde1,0x2800,0x2601);
    getcwd(path,0x3ff);
    sVar8 = strlen(path);
    builtin_strncpy(path + sVar8,"/awesomeface.png",0x11);
    printf("path[%s]\n",path);
    psVar9 = stbi_load(path,&width,&height,&nrChannels,0);
    if (psVar9 == (stbi_uc *)0x0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Failed to load texture",0x16);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x80);
      std::ostream::put(-0x80);
      std::ostream::flush();
    }
    else {
      (*gl3wTexImage2D)(0xde1,0,0x1907,width,height,0,0x1908,0x1401,psVar9);
      (*gl3wGenerateMipmap)(0xde1);
      free(psVar9);
    }
    (*gl3wUseProgram)(shader.pID);
    pcVar1 = Result.value + 1;
    Result.value[0].field_0._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&Result,"texture1","");
    p_Var3 = gl3wUniform1i;
    GVar6 = (*gl3wGetUniformLocation)(shader.pID,(GLchar *)Result.value[0].field_0._0_8_);
    (*p_Var3)(GVar6,0);
    if ((col_type *)Result.value[0].field_0._0_8_ != pcVar1) {
      operator_delete((void *)Result.value[0].field_0._0_8_,
                      CONCAT44(Result.value[1].field_0.field_0.y,Result.value[1].field_0.field_0.x)
                      + 1);
    }
    Result.value[0].field_0._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&Result,"texture2","");
    p_Var3 = gl3wUniform1i;
    GVar6 = (*gl3wGetUniformLocation)(shader.pID,(GLchar *)Result.value[0].field_0._0_8_);
    (*p_Var3)(GVar6,1);
    if ((col_type *)Result.value[0].field_0._0_8_ != pcVar1) {
      operator_delete((void *)Result.value[0].field_0._0_8_,
                      CONCAT44(Result.value[1].field_0.field_0.y,Result.value[1].field_0.field_0.x)
                      + 1);
    }
    while( true ) {
      iVar5 = glfwWindowShouldClose(window);
      if (iVar5 != 0) break;
      dVar2 = (double)glfwGetTime();
      deltaTime = (float)dVar2 - lastFrame;
      lastFrame = (float)dVar2;
      processInput(window);
      ImGui_ImplGlfwGL3_NewFrame();
      if (show_another_window == true) {
        Result.value[0].field_0.field_0.x = 200.0;
        Result.value[0].field_0.field_0.y = 100.0;
        ImGui::SetNextWindowSize((ImVec2 *)&Result,4);
        ImGui::Begin("Another Window",&show_another_window,0);
        ImGui::Text("Options:");
        ImGui::InputInt("Rotate Index",&s1,1,100,0);
        ImGui::End();
      }
      (*gl3wClearColor)(0.2,0.3,0.3,1.0);
      (*gl3wClear)(0x4100);
      (*gl3wActiveTexture)(0x84c0);
      (*gl3wBindTexture)(0xde1,texture1);
      (*gl3wActiveTexture)(0x84c1);
      (*gl3wBindTexture)(0xde1,texture2);
      (*gl3wUseProgram)(shader.pID);
      fVar12 = tanf(fov * 0.017453292 * 0.5);
      Result.value[1].field_0.field_0.y = 1.0 / fVar12;
      Result.value[0].field_0.field_0.x = 1.0 / (fVar12 * 1.3333334);
      Result.value[0].field_0.field_0.y = 0.0;
      Result.value[0].field_0.field_0.z = 0.0;
      Result.value[0].field_0.field_0.w = 0.0;
      Result.value[1].field_0.field_0.x = 0.0;
      Result.value[1].field_0.field_0.z = 0.0;
      Result.value._28_8_ = 0;
      Result.value[2].field_0.field_0.y = 0.0;
      Result.value[3].field_0.field_0.x = 0.0;
      Result.value[3].field_0.field_0.y = 0.0;
      fVar12 = (cameraFront.field_0.field_0.z + cameraPos.field_0.field_0.z) -
               cameraPos.field_0.field_0.z;
      Result_1.value[0].field_0.field_0.w = 0.0;
      Result_1.value[1].field_0.field_0.w = 0.0;
      Result_1.value[2].field_0.field_0.w = 0.0;
      Result_1.value[3].field_0.field_0.w = 1.0;
      fVar13 = (float)cameraPos.field_0._0_8_;
      fVar15 = (float)((ulong)cameraPos.field_0._0_8_ >> 0x20);
      fVar18 = (float)((ulong)cameraUp.field_0._4_8_ >> 0x20);
      fVar16 = ((float)cameraFront.field_0._0_8_ + fVar13) - fVar13;
      fVar17 = ((float)((ulong)cameraFront.field_0._0_8_ >> 0x20) + fVar15) - fVar15;
      fVar14 = 1.0 / SQRT(fVar17 * fVar17 + fVar16 * fVar16 + fVar12 * fVar12);
      fVar12 = fVar12 * fVar14;
      fVar16 = fVar14 * fVar16;
      fVar14 = fVar14 * fVar17;
      fVar17 = cameraUp.field_0.field_0.x * fVar12 - fVar18 * fVar16;
      fVar19 = (float)cameraUp.field_0._4_8_ * fVar16 - fVar14 * cameraUp.field_0.field_0.x;
      fVar20 = fVar18 * fVar14 - fVar12 * (float)cameraUp.field_0._4_8_;
      fVar18 = 1.0 / SQRT(fVar20 * fVar20 + fVar17 * fVar17 + fVar19 * fVar19);
      Result_1.value[0].field_0.field_0.x = fVar20 * fVar18;
      Result_1.value[1].field_0.field_0.x = fVar17 * fVar18;
      Result_1.value[2].field_0.field_0.x = fVar18 * fVar19;
      Result_1.value[0].field_0.field_0.y =
           Result_1.value[1].field_0.field_0.x * fVar12 -
           Result_1.value[2].field_0.field_0.x * fVar14;
      Result_1.value[1].field_0.field_0.y =
           Result_1.value[2].field_0.field_0.x * fVar16 -
           Result_1.value[0].field_0.field_0.x * fVar12;
      Result_1.value[2].field_0.field_0.y =
           fVar14 * Result_1.value[0].field_0.field_0.x -
           Result_1.value[1].field_0.field_0.x * fVar16;
      Result_1.value[0].field_0.field_0.z = -fVar16;
      Result_1.value[1].field_0.field_0.z = -fVar14;
      Result_1.value[2].field_0.field_0.z = -fVar12;
      Result_1.value[3].field_0._0_8_ =
           CONCAT44(Result_1.value[2].field_0.field_0.y * cameraPos.field_0.field_0.z +
                    Result_1.value[1].field_0.field_0.y * fVar15 +
                    fVar13 * Result_1.value[0].field_0.field_0.y,
                    Result_1.value[2].field_0.field_0.x * cameraPos.field_0.field_0.z +
                    Result_1.value[0].field_0.field_0.x * fVar13 +
                    fVar15 * Result_1.value[1].field_0.field_0.x) ^ 0x8000000080000000;
      Result_1.value[3].field_0.field_0.z =
           fVar14 * fVar15 + fVar16 * fVar13 + fVar12 * cameraPos.field_0.field_0.z;
      Result.value[2].field_0.field_0.z = -1.002002;
      Result.value[2].field_0.field_0.w = -1.0;
      Result.value[3].field_0._8_8_ = 0xbe4d0148;
      local_8c8 = &fStack_8b8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_8c8,"projection","");
      p_Var4 = gl3wUniformMatrix4fv;
      GVar6 = (*gl3wGetUniformLocation)(shader.pID,(GLchar *)local_8c8);
      (*p_Var4)(GVar6,1,'\0',(GLfloat *)&Result);
      if (local_8c8 != &fStack_8b8) {
        operator_delete(local_8c8,CONCAT44(fStack_8b4,fStack_8b8) + 1);
      }
      local_8c8 = &fStack_8b8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_8c8,"view","");
      p_Var4 = gl3wUniformMatrix4fv;
      GVar6 = (*gl3wGetUniformLocation)(shader.pID,(GLchar *)local_8c8);
      (*p_Var4)(GVar6,1,'\0',(GLfloat *)&Result_1);
      if (local_8c8 != &fStack_8b8) {
        operator_delete(local_8c8,CONCAT44(fStack_8b4,fStack_8b8) + 1);
      }
      (*gl3wBindVertexArray)(VAO);
      pfVar10 = (float *)&DAT_0015f948;
      uVar11 = 0;
      do {
        local_8c8._0_4_ = 1.0;
        local_8c8._4_4_ = 0.0;
        fStack_8c0 = 0.0;
        fStack_8bc = 0.0;
        fStack_8b8 = 0.0;
        fStack_8b4 = 1.0;
        uStack_8b0 = 0;
        uStack_8a8 = 0;
        local_8a0 = 1.0;
        fVar13 = pfVar10[-2] * 0.0;
        fVar15 = pfVar10[-1] * 0.0;
        fVar14 = *pfVar10 * 0.0;
        fVar12 = fVar15 + fVar13;
        fStack_898 = pfVar10[-2] + fVar15 + fVar14 + 0.0;
        fStack_88c = fVar12 + fVar14 + 1.0;
        local_89c = 0.0;
        _fStack_894 = CONCAT44(fVar12 + *pfVar10 + 0.0,pfVar10[-1] + fVar13 + fVar14 + 0.0);
        fVar12 = (float)(int)uVar11 * 20.0;
        if (uVar11 == (uint)s1) {
          dVar2 = (double)glfwGetTime();
          fVar12 = (float)(dVar2 * 25.0);
        }
        a = fVar12 * 0.017453292;
        local_788 = cosf(a);
        fVar15 = sinf(a);
        fVar14 = 1.0 - local_788;
        fVar17 = fVar14 * 0.8638684;
        fVar16 = fVar14 * 0.25916055;
        fVar25 = fVar17 * 0.4319342 + fVar15 * -0.25916055;
        fVar19 = fVar16 * 0.4319342 + fVar15 * 0.8638684;
        fVar12 = (float)uStack_8b0;
        fVar13 = uStack_8b0._4_4_;
        fVar21 = fVar17 * 0.25916055 + fVar15 * 0.4319342;
        fVar24 = fVar17 * 0.8638684 + local_788;
        fVar31 = (float)uStack_8b0 * fVar21;
        fVar22 = fVar21 * uStack_8b0._4_4_;
        fVar29 = fVar25 * (float)uStack_8a8;
        fVar30 = fVar25 * local_8a0;
        fVar26 = fVar25 * uStack_8a8._4_4_;
        fVar25 = fVar25 * local_89c;
        fVar14 = fVar14 * 0.4319342;
        fVar23 = fVar14 * 0.4319342 + local_788;
        fVar17 = fVar16 * 0.25916055 + local_788;
        fVar16 = fVar16 * 0.8638684 + fVar15 * -0.4319342;
        fVar28 = (float)local_8c8 * fVar16;
        fVar18 = fVar16 * local_8c8._4_4_;
        fVar27 = fVar19 * (float)uStack_8a8;
        fVar20 = fVar19 * uStack_8a8._4_4_;
        uStack_8b0 = CONCAT44(fVar19 * local_89c + fVar17 * uStack_8b0._4_4_ + fVar16 * fStack_8bc,
                              fVar19 * local_8a0 + (float)uStack_8b0 * fVar17 + fVar16 * fStack_8c0)
        ;
        fVar16 = fVar14 * 0.25916055 + fVar15 * -0.8638684;
        fVar15 = fVar14 * 0.8638684 + fVar15 * 0.25916055;
        local_8a0 = local_8a0 * fVar23 + fVar12 * fVar16 + fStack_8c0 * fVar15;
        uStack_8a8 = CONCAT44(fVar23 * uStack_8a8._4_4_ +
                              fVar15 * local_8c8._4_4_ + fStack_8b4 * fVar16,
                              (float)uStack_8a8 * fVar23 +
                              (float)local_8c8 * fVar15 + fStack_8b8 * fVar16);
        _local_89c = CONCAT44(fStack_898,fVar23 * local_89c + fVar16 * fVar13 + fStack_8bc * fVar15)
        ;
        local_8c8._0_4_ = fVar29 + (float)local_8c8 * fVar24 + fVar21 * fStack_8b8;
        local_8c8._4_4_ = fVar26 + fVar24 * local_8c8._4_4_ + fVar21 * fStack_8b4;
        fStack_8c0 = fVar30 + fVar31 + fVar24 * fStack_8c0;
        fStack_8bc = fVar25 + fVar22 + fVar24 * fStack_8bc;
        fStack_8b8 = fVar27 + fVar28 + fVar17 * fStack_8b8;
        fStack_8b4 = fVar20 + fVar18 + fVar17 * fStack_8b4;
        local_830[0] = local_820;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_830,"model","");
        p_Var4 = gl3wUniformMatrix4fv;
        GVar6 = (*gl3wGetUniformLocation)(shader.pID,(GLchar *)local_830[0]);
        (*p_Var4)(GVar6,1,'\0',(GLfloat *)&local_8c8);
        if (local_830[0] != local_820) {
          operator_delete(local_830[0],local_820[0] + 1);
        }
        (*gl3wDrawArrays)(4,0,0x24);
        uVar11 = uVar11 + 1;
        pfVar10 = pfVar10 + 3;
      } while (uVar11 != 10);
      ImGui::Render();
      glfwSwapBuffers(window);
      glfwPollEvents();
    }
    ImGui_ImplGlfwGL3_Shutdown();
    (*gl3wDeleteVertexArrays)(1,&VAO);
    (*gl3wDeleteBuffers)(1,&VBO);
    glfwTerminate();
    Shader::~Shader(&shader);
    iVar5 = 0;
  }
  return iVar5;
}

Assistant:

int main(int, char**)
{
    // Setup window
    char path[1024];
    bool show_another_window = true;

    GLuint ID;
    glfwSetErrorCallback(error_callback);

    if (!glfwInit())
      return 1;

    glfwWindowHint(GLFW_CONTEXT_VERSION_MAJOR, 3);
    glfwWindowHint(GLFW_CONTEXT_VERSION_MINOR, 3);
    glfwWindowHint(GLFW_OPENGL_PROFILE, GLFW_OPENGL_CORE_PROFILE);
#if __APPLE__
    glfwWindowHint(GLFW_OPENGL_FORWARD_COMPAT, GL_TRUE);
#endif
    GLFWwindow* window = glfwCreateWindow(SCR_WIDTH, SCR_HEIGHT, "ImGui GLFW example 09", NULL, NULL);
    glfwMakeContextCurrent(window);
    glfwSetFramebufferSizeCallback(window, framebuffer_size_callback);
    glfwSetCursorPosCallback(window, mouse_callback);
    glfwSetScrollCallback(window, scroll_callback);

    // tell GLFW to capture our mouse
    glfwSetInputMode(window, GLFW_CURSOR, GLFW_CURSOR_DISABLED);

    gl3wInit();
    glEnable(GL_DEPTH_TEST);

    int nrAttributes;
    glGetIntegerv(GL_MAX_VERTEX_ATTRIBS, &nrAttributes);
    std::cout << "Maximum nr of vertex attributes supported: " << nrAttributes << std::endl;

    // Setup ImGui binding
    ImGui_ImplGlfwGL3_Init(window, true);

    ImVec4 clear_color = ImColor(114, 144, 154);

    // ------------------------------------
    // vertex shader
    getcwd((char*)path,1023);
    Shader shader;
    shader.loadVS(path);
    shader.loadFS(path);
    shader.build();

    // set up vertex data (and buffer(s)) and configure vertex attributes
    // ------------------------------------------------------------------
    float vertices[] = {
        -0.5f, -0.5f, -0.5f,  0.0f, 0.0f,
         0.5f, -0.5f, -0.5f,  1.0f, 0.0f,
         0.5f,  0.5f, -0.5f,  1.0f, 1.0f,
         0.5f,  0.5f, -0.5f,  1.0f, 1.0f,
        -0.5f,  0.5f, -0.5f,  0.0f, 1.0f,
        -0.5f, -0.5f, -0.5f,  0.0f, 0.0f,

        -0.5f, -0.5f,  0.5f,  0.0f, 0.0f,
         0.5f, -0.5f,  0.5f,  1.0f, 0.0f,
         0.5f,  0.5f,  0.5f,  1.0f, 1.0f,
         0.5f,  0.5f,  0.5f,  1.0f, 1.0f,
        -0.5f,  0.5f,  0.5f,  0.0f, 1.0f,
        -0.5f, -0.5f,  0.5f,  0.0f, 0.0f,

        -0.5f,  0.5f,  0.5f,  1.0f, 0.0f,
        -0.5f,  0.5f, -0.5f,  1.0f, 1.0f,
        -0.5f, -0.5f, -0.5f,  0.0f, 1.0f,
        -0.5f, -0.5f, -0.5f,  0.0f, 1.0f,
        -0.5f, -0.5f,  0.5f,  0.0f, 0.0f,
        -0.5f,  0.5f,  0.5f,  1.0f, 0.0f,

         0.5f,  0.5f,  0.5f,  1.0f, 0.0f,
         0.5f,  0.5f, -0.5f,  1.0f, 1.0f,
         0.5f, -0.5f, -0.5f,  0.0f, 1.0f,
         0.5f, -0.5f, -0.5f,  0.0f, 1.0f,
         0.5f, -0.5f,  0.5f,  0.0f, 0.0f,
         0.5f,  0.5f,  0.5f,  1.0f, 0.0f,

        -0.5f, -0.5f, -0.5f,  0.0f, 1.0f,
         0.5f, -0.5f, -0.5f,  1.0f, 1.0f,
         0.5f, -0.5f,  0.5f,  1.0f, 0.0f,
         0.5f, -0.5f,  0.5f,  1.0f, 0.0f,
        -0.5f, -0.5f,  0.5f,  0.0f, 0.0f,
        -0.5f, -0.5f, -0.5f,  0.0f, 1.0f,

        -0.5f,  0.5f, -0.5f,  0.0f, 1.0f,
         0.5f,  0.5f, -0.5f,  1.0f, 1.0f,
         0.5f,  0.5f,  0.5f,  1.0f, 0.0f,
         0.5f,  0.5f,  0.5f,  1.0f, 0.0f,
        -0.5f,  0.5f,  0.5f,  0.0f, 0.0f,
        -0.5f,  0.5f, -0.5f,  0.0f, 1.0f
    };
    // world space positions of our cubes
    glm::vec3 cubePositions[] = {
        glm::vec3( 0.0f,  0.0f,  0.0f),
        glm::vec3( 2.0f,  5.0f, -15.0f),
        glm::vec3(-1.5f, -2.2f, -2.5f),
        glm::vec3(-3.8f, -2.0f, -12.3f),
        glm::vec3( 2.4f, -0.4f, -3.5f),
        glm::vec3(-1.7f,  3.0f, -7.5f),
        glm::vec3( 1.3f, -2.0f, -2.5f),
        glm::vec3( 1.5f,  2.0f, -2.5f),
        glm::vec3( 1.5f,  0.2f, -1.5f),
        glm::vec3(-1.3f,  1.0f, -1.5f)
    };
    unsigned int VBO, VAO;
    glGenVertexArrays(1, &VAO);
    glGenBuffers(1, &VBO);

    glBindVertexArray(VAO);

    glBindBuffer(GL_ARRAY_BUFFER, VBO);
    glBufferData(GL_ARRAY_BUFFER, sizeof(vertices), vertices, GL_STATIC_DRAW);

    // position attribute
    glVertexAttribPointer(0, 3, GL_FLOAT, GL_FALSE, 5 * sizeof(float), (void*)0);
    glEnableVertexAttribArray(0);
    // texture coord attribute
    glVertexAttribPointer(1, 2, GL_FLOAT, GL_FALSE, 5 * sizeof(float), (void*)(3 * sizeof(float)));
    glEnableVertexAttribArray(1);


    // load and create a texture
    // -------------------------
    unsigned int texture1, texture2;
    // texture 1
    // ---------
    glGenTextures(1, &texture1);
    glBindTexture(GL_TEXTURE_2D, texture1);
    // set the texture wrapping parameters
    glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_S, GL_REPEAT);
    glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_T, GL_REPEAT);
    // set texture filtering parameters
    glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_LINEAR);
    glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_LINEAR);
    // load image, create texture and generate mipmaps
    int width, height, nrChannels;
    stbi_set_flip_vertically_on_load(true); // tell stb_image.h to flip loaded texture's on the y-axis.


    getcwd((char*)path,1023);
    strcat((char*)path,"/container.jpg");
    printf("path[%s]\n",(char*)path);
    unsigned char *data = stbi_load((char*)path, &width, &height, &nrChannels, 0);
    if (data){
      glTexImage2D(GL_TEXTURE_2D, 0, GL_RGB, width, height, 0, GL_RGB, GL_UNSIGNED_BYTE, data);
      glGenerateMipmap(GL_TEXTURE_2D);
    }
    else{
        std::cout << "Failed to load texture" << std::endl;
    }
    stbi_image_free(data);
    // texture 2
    // ---------
    glGenTextures(1, &texture2);
    glBindTexture(GL_TEXTURE_2D, texture2);
    // set the texture wrapping parameters
    glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_S, GL_REPEAT);
    glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_T, GL_REPEAT);
    // set texture filtering parameters
    glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_LINEAR);
    glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_LINEAR);
    // load image, create texture and generate mipmaps
    getcwd((char*)path,1023);
    strcat((char*)path,"/awesomeface.png");
    printf("path[%s]\n",(char*)path);
    data = stbi_load((char*)path, &width, &height, &nrChannels, 0);
    if (data){
        // note that the awesomeface.png has transparency and thus an alpha channel, so make sure to tell OpenGL the data type is of GL_RGBA
        glTexImage2D(GL_TEXTURE_2D, 0, GL_RGB, width, height, 0, GL_RGBA, GL_UNSIGNED_BYTE, data);
        glGenerateMipmap(GL_TEXTURE_2D);
    }
    else{
        std::cout << "Failed to load texture" << std::endl;
    }
    stbi_image_free(data);

    shader.use();
    shader.setInt("texture1", 0);
    shader.setInt("texture2", 1);
    //// END VERTEX
    while (!glfwWindowShouldClose(window)){

        float currentFrame = glfwGetTime();
        deltaTime = currentFrame - lastFrame;
        lastFrame = currentFrame;
        processInput(window);

        ImGui_ImplGlfwGL3_NewFrame();
        // 1. Show a simple window
        if (show_another_window){
            ImGui::SetNextWindowSize(ImVec2(200,100), ImGuiSetCond_FirstUseEver);
            ImGui::Begin("Another Window", &show_another_window);
            ShowAnotherWindow();
            ImGui::End();
        }
        // render
        // ------
        glClearColor(0.2f, 0.3f, 0.3f, 1.0f);
        glClear(GL_COLOR_BUFFER_BIT | GL_DEPTH_BUFFER_BIT); // also clear the depth buffer now!

         // bind textures on corresponding texture units
        glActiveTexture(GL_TEXTURE0);
        glBindTexture(GL_TEXTURE_2D, texture1);
        glActiveTexture(GL_TEXTURE1);
        glBindTexture(GL_TEXTURE_2D, texture2);

        // activate shader
        shader.use();

        // create transformations
        glm::mat4 projection = glm::perspective(glm::radians(fov), (float)SCR_WIDTH / (float)SCR_HEIGHT, 0.1f, 100.0f);
        glm::mat4 view = glm::lookAt(cameraPos, cameraPos + cameraFront, cameraUp);
        shader.setMat4("projection", projection);
        shader.setMat4("view", view);

        // render boxes
        glBindVertexArray(VAO);
        for (unsigned int i = 0; i < 10; i++)
        {
            // calculate the model matrix for each object and pass it to shader before drawing
            glm::mat4 model;
            model = glm::translate(model, cubePositions[i]);
            float angle = 20.0f * i;
            //model = glm::rotate(model, glm::radians(angle), glm::vec3(1.0f, 0.3f, 0.5f));
            //model = glm::rotate(model, (float)glfwGetTime() * glm::radians(50.0f), glm::vec3(0.5f, 1.0f, 0.0f));
            //glUniformMatrix4fv(glGetUniformLocation(shader.getpID(), "model"), 1, GL_FALSE, &model[0][0]);
            if(s1!=-1){  // every 3rd iteration (including the first) we set the angle using GLFW's time function.
              if(i==s1)
                angle = glfwGetTime() * 25.0f;
            }
            model = glm::rotate(model, glm::radians(angle), glm::vec3(1.0f, 0.3f, 0.5f));
            shader.setMat4("model", model);
            glDrawArrays(GL_TRIANGLES, 0, 36);
        }

        ImGui::Render();
        glfwSwapBuffers(window);
        glfwPollEvents();
    }

    // Cleanup
    ImGui_ImplGlfwGL3_Shutdown();

    glDeleteVertexArrays(1, &VAO);
    glDeleteBuffers(1, &VBO);

    glfwTerminate();
    return 0;
}